

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdcoefct.c
# Opt level: O1

int decompress_smooth_data(j_decompress_ptr cinfo,JSAMPIMAGE output_buf)

{
  ushort uVar1;
  ushort uVar2;
  ushort uVar3;
  ushort uVar4;
  ushort uVar5;
  ushort uVar6;
  uint uVar7;
  jpeg_d_coef_controller *pjVar8;
  inverse_DCT_method_ptr p_Var9;
  JQUANT_TBL *pJVar10;
  _func_void_j_decompress_ptr *p_Var11;
  JBLOCKROW paJVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [12];
  long lVar23;
  long lVar24;
  long lVar25;
  uint uVar26;
  int iVar27;
  uint uVar28;
  int iVar29;
  JBLOCKARRAY ppaJVar30;
  long lVar31;
  ulong uVar32;
  uint uVar33;
  int iVar34;
  int iVar35;
  int iVar36;
  int iVar37;
  JBLOCKROW paJVar38;
  long lVar39;
  int iVar40;
  int iVar41;
  int iVar42;
  int iVar43;
  uint uVar44;
  int iVar45;
  jpeg_component_info *pjVar46;
  JDIMENSION JVar47;
  JBLOCK workspace;
  int local_1dc;
  int local_1d8;
  int local_1d0;
  int local_1cc;
  long local_1c8;
  JBLOCKROW local_1a0;
  JSAMPARRAY local_198;
  JCOEF local_b8;
  short local_b6;
  short local_b4;
  short local_a8;
  short local_a6;
  short local_98;
  
  pjVar8 = cinfo->coef;
  uVar26 = cinfo->total_iMCU_rows - 1;
  while( true ) {
    if (((cinfo->output_scan_number < cinfo->input_scan_number) ||
        (cinfo->inputctl->eoi_reached != 0)) ||
       ((cinfo->input_scan_number == cinfo->output_scan_number &&
        (cinfo->output_iMCU_row + (uint)(cinfo->Ss == 0) < cinfo->input_iMCU_row)))) break;
    iVar27 = (*cinfo->inputctl->consume_input)(cinfo);
    if (iVar27 == 0) {
      return 0;
    }
  }
  if (0 < cinfo->num_components) {
    pjVar46 = cinfo->comp_info;
    local_1c8 = 0;
    do {
      if (pjVar46->component_needed != 0) {
        uVar7 = cinfo->output_iMCU_row;
        if (uVar7 < uVar26) {
          uVar33 = pjVar46->v_samp_factor;
          JVar47 = pjVar46->v_samp_factor * 2;
        }
        else {
          uVar28 = pjVar46->v_samp_factor;
          uVar33 = pjVar46->height_in_blocks % uVar28;
          JVar47 = uVar33;
          if (uVar33 == 0) {
            uVar33 = uVar28;
            JVar47 = uVar28;
          }
        }
        if (uVar7 == 0) {
          ppaJVar30 = (*cinfo->mem->access_virt_barray)
                                ((j_common_ptr)cinfo,
                                 (jvirt_barray_ptr)(&pjVar8[3].start_output_pass)[local_1c8],0,
                                 JVar47,0);
        }
        else {
          ppaJVar30 = (*cinfo->mem->access_virt_barray)
                                ((j_common_ptr)cinfo,
                                 (jvirt_barray_ptr)(&pjVar8[3].start_output_pass)[local_1c8],
                                 (uVar7 - 1) * pjVar46->v_samp_factor,
                                 JVar47 + pjVar46->v_samp_factor,0);
          ppaJVar30 = ppaJVar30 + pjVar46->v_samp_factor;
        }
        if (0 < (int)uVar33) {
          p_Var9 = cinfo->idct->inverse_DCT[local_1c8];
          pJVar10 = pjVar46->quant_table;
          uVar1 = pJVar10->quantval[2];
          uVar2 = pJVar10->quantval[9];
          uVar3 = pJVar10->quantval[0x10];
          uVar4 = pJVar10->quantval[8];
          uVar5 = pJVar10->quantval[1];
          uVar6 = pJVar10->quantval[0];
          lVar23 = local_1c8 * 0x18;
          lVar24 = (ulong)((uint)uVar6 * 4) * 9;
          lVar25 = (ulong)uVar6 * 9;
          local_198 = output_buf[local_1c8];
          p_Var11 = pjVar8[5].start_output_pass;
          uVar32 = 0;
          do {
            paJVar12 = ppaJVar30[uVar32];
            local_1a0 = paJVar12;
            if (uVar7 != 0 || (int)uVar32 != 0) {
              local_1a0 = ppaJVar30[uVar32 - 1];
            }
            if ((uVar7 < uVar26) || (paJVar38 = paJVar12, uVar32 != uVar33 - 1)) {
              paJVar38 = ppaJVar30[uVar32 + 1];
            }
            local_1dc = (int)(*local_1a0)[0];
            local_1d8 = (int)(*paJVar38)[0];
            uVar28 = pjVar46->width_in_blocks - 1;
            lVar39 = 0;
            uVar44 = 0;
            JVar47 = 0;
            iVar27 = (int)(*paJVar12)[0];
            iVar45 = (int)(*paJVar12)[0];
            local_1d0 = local_1d8;
            local_1cc = local_1dc;
            do {
              iVar40 = iVar27;
              iVar43 = local_1cc;
              iVar36 = local_1d0;
              iVar37 = local_1d8;
              iVar29 = local_1dc;
              local_1dc = local_1cc;
              local_1d8 = local_1d0;
              jcopy_block_row((JBLOCKROW)((long)*paJVar12 + lVar39),(JBLOCKROW)&local_b8,1);
              iVar27 = iVar40;
              if (uVar44 < uVar28) {
                local_1cc = (int)*(short *)((long)local_1a0[1] + lVar39);
                iVar27 = (int)*(short *)((long)paJVar12[1] + lVar39);
                local_1d0 = (int)*(short *)((long)paJVar38[1] + lVar39);
              }
              iVar35 = *(int *)(p_Var11 + lVar23 + 4);
              if ((iVar35 != 0) && (local_b6 == 0)) {
                lVar31 = (iVar45 - iVar27) * lVar24;
                if (lVar31 < 0) {
                  auVar14._8_8_ = 0;
                  auVar14._0_8_ = (ulong)uVar5 * 0x80 - lVar31;
                  iVar41 = 1 << ((byte)iVar35 & 0x1f);
                  iVar34 = SUB164(auVar14 / (ZEXT216(uVar5) << 8),0);
                  iVar42 = iVar41 + -1;
                  if (iVar34 < iVar41) {
                    iVar42 = iVar34;
                  }
                  if (iVar35 < 1) {
                    iVar42 = iVar34;
                  }
                  local_b6 = -(short)iVar42;
                }
                else {
                  auVar13._8_8_ = 0;
                  auVar13._0_8_ = lVar31 + (ulong)uVar5 * 0x80;
                  auVar13 = auVar13 / (ZEXT216(uVar5) << 8);
                  local_b6 = auVar13._0_2_;
                  if (0 < iVar35) {
                    iVar34 = 1 << ((byte)iVar35 & 0x1f);
                    iVar42 = auVar13._0_4_;
                    iVar35 = iVar34 + -1;
                    if (iVar42 < iVar34) {
                      iVar35 = iVar42;
                    }
                    local_b6 = (short)iVar35;
                  }
                }
              }
              iVar35 = *(int *)(p_Var11 + lVar23 + 8);
              if ((iVar35 != 0) && (local_a8 == 0)) {
                lVar31 = (iVar43 - iVar36) * lVar24;
                if (lVar31 < 0) {
                  auVar16._8_8_ = 0;
                  auVar16._0_8_ = (ulong)uVar4 * 0x80 - lVar31;
                  iVar41 = 1 << ((byte)iVar35 & 0x1f);
                  iVar34 = SUB164(auVar16 / (ZEXT216(uVar4) << 8),0);
                  iVar42 = iVar41 + -1;
                  if (iVar34 < iVar41) {
                    iVar42 = iVar34;
                  }
                  if (iVar35 < 1) {
                    iVar42 = iVar34;
                  }
                  local_a8 = -(short)iVar42;
                }
                else {
                  auVar15._8_8_ = 0;
                  auVar15._0_8_ = lVar31 + (ulong)uVar4 * 0x80;
                  auVar15 = auVar15 / (ZEXT216(uVar4) << 8);
                  local_a8 = auVar15._0_2_;
                  if (0 < iVar35) {
                    iVar34 = 1 << ((byte)iVar35 & 0x1f);
                    iVar42 = auVar15._0_4_;
                    iVar35 = iVar34 + -1;
                    if (iVar42 < iVar34) {
                      iVar35 = iVar42;
                    }
                    local_a8 = (short)iVar35;
                  }
                }
              }
              iVar35 = *(int *)(p_Var11 + lVar23 + 0xc);
              if ((iVar35 != 0) && (local_98 == 0)) {
                lVar31 = (iVar43 + iVar40 * -2 + iVar36) * lVar25;
                if (lVar31 < 0) {
                  auVar18._8_8_ = 0;
                  auVar18._0_8_ = (ulong)uVar3 * 0x80 - lVar31;
                  iVar42 = 1 << ((byte)iVar35 & 0x1f);
                  iVar43 = SUB164(auVar18 / (ZEXT216(uVar3) << 8),0);
                  iVar36 = iVar42 + -1;
                  if (iVar43 < iVar42) {
                    iVar36 = iVar43;
                  }
                  if (iVar35 < 1) {
                    iVar36 = iVar43;
                  }
                  local_98 = -(short)iVar36;
                }
                else {
                  auVar17._8_8_ = 0;
                  auVar17._0_8_ = lVar31 + (ulong)uVar3 * 0x80;
                  auVar17 = auVar17 / (ZEXT216(uVar3) << 8);
                  local_98 = auVar17._0_2_;
                  if (0 < iVar35) {
                    iVar35 = 1 << ((byte)iVar35 & 0x1f);
                    iVar43 = auVar17._0_4_;
                    iVar36 = iVar35 + -1;
                    if (iVar43 < iVar35) {
                      iVar36 = iVar43;
                    }
                    local_98 = (short)iVar36;
                  }
                }
              }
              iVar36 = *(int *)(p_Var11 + lVar23 + 0x10);
              if ((iVar36 != 0) && (local_a6 == 0)) {
                lVar31 = (long)((iVar29 - (iVar37 + local_1cc)) + local_1d0) * (ulong)uVar6 * 5;
                if (lVar31 < 0) {
                  auVar20._8_8_ = 0;
                  auVar20._0_8_ = (ulong)uVar2 * 0x80 - lVar31;
                  iVar43 = 1 << ((byte)iVar36 & 0x1f);
                  iVar37 = SUB164(auVar20 / (ZEXT216(uVar2) << 8),0);
                  iVar29 = iVar43 + -1;
                  if (iVar37 < iVar43) {
                    iVar29 = iVar37;
                  }
                  if (iVar36 < 1) {
                    iVar29 = iVar37;
                  }
                  local_a6 = -(short)iVar29;
                }
                else {
                  auVar19._8_8_ = 0;
                  auVar19._0_8_ = lVar31 + (ulong)uVar2 * 0x80;
                  auVar19 = auVar19 / (ZEXT216(uVar2) << 8);
                  local_a6 = auVar19._0_2_;
                  if (0 < iVar36) {
                    iVar36 = 1 << ((byte)iVar36 & 0x1f);
                    iVar37 = auVar19._0_4_;
                    iVar29 = iVar36 + -1;
                    if (iVar37 < iVar36) {
                      iVar29 = iVar37;
                    }
                    local_a6 = (short)iVar29;
                  }
                }
              }
              iVar29 = *(int *)(p_Var11 + lVar23 + 0x14);
              if ((iVar29 != 0) && (local_b4 == 0)) {
                lVar31 = (iVar45 + iVar40 * -2 + iVar27) * lVar25;
                if (lVar31 < 0) {
                  auVar21._8_8_ = 0;
                  auVar21._0_8_ = (ulong)uVar1 * 0x80 - lVar31;
                  iVar36 = 1 << ((byte)iVar29 & 0x1f);
                  iVar37 = SUB164(auVar21 / (ZEXT216(uVar1) << 8),0);
                  iVar45 = iVar36 + -1;
                  if (iVar37 < iVar36) {
                    iVar45 = iVar37;
                  }
                  if (iVar29 < 1) {
                    iVar45 = iVar37;
                  }
                  local_b4 = -(short)iVar45;
                }
                else {
                  auVar22._8_4_ = 0;
                  auVar22._0_8_ = lVar31 + (ulong)uVar1 * 0x80;
                  auVar22 = auVar22 / (ZEXT212(uVar1) << 8);
                  local_b4 = auVar22._0_2_;
                  if (0 < iVar29) {
                    iVar37 = 1 << ((byte)iVar29 & 0x1f);
                    iVar29 = auVar22._0_4_;
                    iVar45 = iVar37 + -1;
                    if (iVar29 < iVar37) {
                      iVar45 = iVar29;
                    }
                    local_b4 = (short)iVar45;
                  }
                }
              }
              (*p_Var9)(cinfo,pjVar46,&local_b8,local_198,JVar47);
              JVar47 = JVar47 + pjVar46->DCT_h_scaled_size;
              uVar44 = uVar44 + 1;
              lVar39 = lVar39 + 0x80;
              iVar45 = iVar40;
            } while (uVar44 <= uVar28);
            local_198 = local_198 + pjVar46->DCT_v_scaled_size;
            uVar32 = uVar32 + 1;
          } while (uVar32 != uVar33);
        }
      }
      local_1c8 = local_1c8 + 1;
      pjVar46 = pjVar46 + 1;
    } while (local_1c8 < cinfo->num_components);
  }
  uVar26 = cinfo->output_iMCU_row + 1;
  cinfo->output_iMCU_row = uVar26;
  return 4 - (uint)(uVar26 < cinfo->total_iMCU_rows);
}

Assistant:

METHODDEF(int)
decompress_smooth_data (j_decompress_ptr cinfo, JSAMPIMAGE output_buf)
{
  my_coef_ptr coef = (my_coef_ptr) cinfo->coef;
  JDIMENSION last_iMCU_row = cinfo->total_iMCU_rows - 1;
  JDIMENSION block_num, last_block_column;
  int ci, block_row, block_rows, access_rows;
  JBLOCKARRAY buffer;
  JBLOCKROW buffer_ptr, prev_block_row, next_block_row;
  JSAMPARRAY output_ptr;
  JDIMENSION output_col;
  jpeg_component_info *compptr;
  inverse_DCT_method_ptr inverse_DCT;
  boolean first_row, last_row;
  JBLOCK workspace;
  int *coef_bits;
  JQUANT_TBL *quanttbl;
  INT32 Q00,Q01,Q02,Q10,Q11,Q20, num;
  int DC1,DC2,DC3,DC4,DC5,DC6,DC7,DC8,DC9;
  int Al, pred;

  /* Force some input to be done if we are getting ahead of the input. */
  while (cinfo->input_scan_number <= cinfo->output_scan_number &&
	 ! cinfo->inputctl->eoi_reached) {
    if (cinfo->input_scan_number == cinfo->output_scan_number) {
      /* If input is working on current scan, we ordinarily want it to
       * have completed the current row.  But if input scan is DC,
       * we want it to keep one row ahead so that next block row's DC
       * values are up to date.
       */
      JDIMENSION delta = (cinfo->Ss == 0) ? 1 : 0;
      if (cinfo->input_iMCU_row > cinfo->output_iMCU_row+delta)
	break;
    }
    if ((*cinfo->inputctl->consume_input)(cinfo) == JPEG_SUSPENDED)
      return JPEG_SUSPENDED;
  }

  /* OK, output from the virtual arrays. */
  for (ci = 0, compptr = cinfo->comp_info; ci < cinfo->num_components;
       ci++, compptr++) {
    /* Don't bother to IDCT an uninteresting component. */
    if (! compptr->component_needed)
      continue;
    /* Count non-dummy DCT block rows in this iMCU row. */
    if (cinfo->output_iMCU_row < last_iMCU_row) {
      block_rows = compptr->v_samp_factor;
      access_rows = block_rows * 2; /* this and next iMCU row */
      last_row = FALSE;
    } else {
      /* NB: can't use last_row_height here; it is input-side-dependent! */
      block_rows = (int) (compptr->height_in_blocks % compptr->v_samp_factor);
      if (block_rows == 0) block_rows = compptr->v_samp_factor;
      access_rows = block_rows; /* this iMCU row only */
      last_row = TRUE;
    }
    /* Align the virtual buffer for this component. */
    if (cinfo->output_iMCU_row > 0) {
      access_rows += compptr->v_samp_factor; /* prior iMCU row too */
      buffer = (*cinfo->mem->access_virt_barray)
	((j_common_ptr) cinfo, coef->whole_image[ci],
	 (cinfo->output_iMCU_row - 1) * compptr->v_samp_factor,
	 (JDIMENSION) access_rows, FALSE);
      buffer += compptr->v_samp_factor;	/* point to current iMCU row */
      first_row = FALSE;
    } else {
      buffer = (*cinfo->mem->access_virt_barray)
	((j_common_ptr) cinfo, coef->whole_image[ci],
	 (JDIMENSION) 0, (JDIMENSION) access_rows, FALSE);
      first_row = TRUE;
    }
    /* Fetch component-dependent info */
    coef_bits = coef->coef_bits_latch + (ci * SAVED_COEFS);
    quanttbl = compptr->quant_table;
    Q00 = quanttbl->quantval[0];
    Q01 = quanttbl->quantval[Q01_POS];
    Q10 = quanttbl->quantval[Q10_POS];
    Q20 = quanttbl->quantval[Q20_POS];
    Q11 = quanttbl->quantval[Q11_POS];
    Q02 = quanttbl->quantval[Q02_POS];
    inverse_DCT = cinfo->idct->inverse_DCT[ci];
    output_ptr = output_buf[ci];
    /* Loop over all DCT blocks to be processed. */
    for (block_row = 0; block_row < block_rows; block_row++) {
      buffer_ptr = buffer[block_row];
      if (first_row && block_row == 0)
	prev_block_row = buffer_ptr;
      else
	prev_block_row = buffer[block_row-1];
      if (last_row && block_row == block_rows-1)
	next_block_row = buffer_ptr;
      else
	next_block_row = buffer[block_row+1];
      /* We fetch the surrounding DC values using a sliding-register approach.
       * Initialize all nine here so as to do the right thing on narrow pics.
       */
      DC1 = DC2 = DC3 = (int) prev_block_row[0][0];
      DC4 = DC5 = DC6 = (int) buffer_ptr[0][0];
      DC7 = DC8 = DC9 = (int) next_block_row[0][0];
      output_col = 0;
      last_block_column = compptr->width_in_blocks - 1;
      for (block_num = 0; block_num <= last_block_column; block_num++) {
	/* Fetch current DCT block into workspace so we can modify it. */
	jcopy_block_row(buffer_ptr, (JBLOCKROW) workspace, (JDIMENSION) 1);
	/* Update DC values */
	if (block_num < last_block_column) {
	  DC3 = (int) prev_block_row[1][0];
	  DC6 = (int) buffer_ptr[1][0];
	  DC9 = (int) next_block_row[1][0];
	}
	/* Compute coefficient estimates per K.8.
	 * An estimate is applied only if coefficient is still zero,
	 * and is not known to be fully accurate.
	 */
	/* AC01 */
	if ((Al=coef_bits[1]) != 0 && workspace[1] == 0) {
	  num = 36 * Q00 * (DC4 - DC6);
	  if (num >= 0) {
	    pred = (int) (((Q01<<7) + num) / (Q01<<8));
	    if (Al > 0 && pred >= (1<<Al))
	      pred = (1<<Al)-1;
	  } else {
	    pred = (int) (((Q01<<7) - num) / (Q01<<8));
	    if (Al > 0 && pred >= (1<<Al))
	      pred = (1<<Al)-1;
	    pred = -pred;
	  }
	  workspace[1] = (JCOEF) pred;
	}
	/* AC10 */
	if ((Al=coef_bits[2]) != 0 && workspace[8] == 0) {
	  num = 36 * Q00 * (DC2 - DC8);
	  if (num >= 0) {
	    pred = (int) (((Q10<<7) + num) / (Q10<<8));
	    if (Al > 0 && pred >= (1<<Al))
	      pred = (1<<Al)-1;
	  } else {
	    pred = (int) (((Q10<<7) - num) / (Q10<<8));
	    if (Al > 0 && pred >= (1<<Al))
	      pred = (1<<Al)-1;
	    pred = -pred;
	  }
	  workspace[8] = (JCOEF) pred;
	}
	/* AC20 */
	if ((Al=coef_bits[3]) != 0 && workspace[16] == 0) {
	  num = 9 * Q00 * (DC2 + DC8 - 2*DC5);
	  if (num >= 0) {
	    pred = (int) (((Q20<<7) + num) / (Q20<<8));
	    if (Al > 0 && pred >= (1<<Al))
	      pred = (1<<Al)-1;
	  } else {
	    pred = (int) (((Q20<<7) - num) / (Q20<<8));
	    if (Al > 0 && pred >= (1<<Al))
	      pred = (1<<Al)-1;
	    pred = -pred;
	  }
	  workspace[16] = (JCOEF) pred;
	}
	/* AC11 */
	if ((Al=coef_bits[4]) != 0 && workspace[9] == 0) {
	  num = 5 * Q00 * (DC1 - DC3 - DC7 + DC9);
	  if (num >= 0) {
	    pred = (int) (((Q11<<7) + num) / (Q11<<8));
	    if (Al > 0 && pred >= (1<<Al))
	      pred = (1<<Al)-1;
	  } else {
	    pred = (int) (((Q11<<7) - num) / (Q11<<8));
	    if (Al > 0 && pred >= (1<<Al))
	      pred = (1<<Al)-1;
	    pred = -pred;
	  }
	  workspace[9] = (JCOEF) pred;
	}
	/* AC02 */
	if ((Al=coef_bits[5]) != 0 && workspace[2] == 0) {
	  num = 9 * Q00 * (DC4 + DC6 - 2*DC5);
	  if (num >= 0) {
	    pred = (int) (((Q02<<7) + num) / (Q02<<8));
	    if (Al > 0 && pred >= (1<<Al))
	      pred = (1<<Al)-1;
	  } else {
	    pred = (int) (((Q02<<7) - num) / (Q02<<8));
	    if (Al > 0 && pred >= (1<<Al))
	      pred = (1<<Al)-1;
	    pred = -pred;
	  }
	  workspace[2] = (JCOEF) pred;
	}
	/* OK, do the IDCT */
	(*inverse_DCT) (cinfo, compptr, (JCOEFPTR) workspace,
			output_ptr, output_col);
	/* Advance for next column */
	DC1 = DC2; DC2 = DC3;
	DC4 = DC5; DC5 = DC6;
	DC7 = DC8; DC8 = DC9;
	buffer_ptr++, prev_block_row++, next_block_row++;
	output_col += compptr->DCT_h_scaled_size;
      }
      output_ptr += compptr->DCT_v_scaled_size;
    }
  }

  if (++(cinfo->output_iMCU_row) < cinfo->total_iMCU_rows)
    return JPEG_ROW_COMPLETED;
  return JPEG_SCAN_COMPLETED;
}